

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::composeSequenceInfo(CLPIParser *this,BitStreamWriter *writer)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  uint32_t uVar7;
  
  puVar6 = (writer->super_BitStream).m_initBuffer;
  iVar1 = *(int *)&(writer->super_BitStream).m_buffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  iVar3 = *(int *)&(writer->super_BitStream).m_buffer;
  iVar4 = *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar5 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,8,1);
  BitStreamWriter::putBits(writer,0x20,0);
  BitStreamWriter::putBits(writer,8,1);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,0x10,0x1001);
  BitStreamWriter::putBits(writer,0x20,0);
  BitStreamWriter::putBits(writer,0x20,this->presentation_start_time);
  BitStreamWriter::putBits(writer,0x20,this->presentation_end_time);
  uVar7 = my_ntohl((int)((iVar3 - iVar4) * 8 + uVar5) / -8 +
                   (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8);
  *(uint32_t *)((long)puVar6 + (long)((int)((iVar1 - (int)puVar6) * 8 + uVar2) / 8)) = uVar7;
  return;
}

Assistant:

void CLPIParser::composeSequenceInfo(BitStreamWriter& writer) const
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, 0);  // reserved_for_word_align
    writer.putBits(8, 1);  // number_of_ATC_sequences
    // for (int atc_id = 0; atc_id < number_of_ATC_sequences; atc_id++)
    {
        writer.putBits(32, 0);  // SPN_ATC_start
        writer.putBits(8, 1);   // number_of_STC_sequences
        writer.putBits(8, 0);   // offset_STC_id
        // for (int stc_id=offset_STC_id; stc_id < number_of_STC_sequences + offset_STC_id; stc_id++)
        {
            writer.putBits(16, DEFAULT_PCR_PID);
            writer.putBits(32, 0);  // SPN_STC_start
            writer.putBits(32, presentation_start_time);
            writer.putBits(32, presentation_end_time);
        }
    }
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}